

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_output_only_noop_Test::TestBody(cubeb_resampler_output_only_noop_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  long got;
  float out_buffer [128];
  long out_frames;
  cubeb_resampler *resampler;
  int target_rate;
  cubeb_stream_params output_params;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  uint uVar4;
  AssertHelper in_stack_fffffffffffffda0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffda8;
  uint in_stack_fffffffffffffdb4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb8;
  cubeb_stream_params *in_stack_fffffffffffffdc0;
  cubeb_stream *in_stack_fffffffffffffdc8;
  cubeb_resampler_quality in_stack_fffffffffffffde0;
  cubeb_resampler_reclock in_stack_fffffffffffffde8;
  
  uVar2 = 0;
  uVar3 = 0;
  cubeb_resampler_create
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             (cubeb_stream_params *)in_stack_fffffffffffffdb8.ptr_,in_stack_fffffffffffffdb4,
             (cubeb_data_callback)in_stack_fffffffffffffda8.ptr_,in_stack_fffffffffffffda0.data_,
             in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
  cubeb_resampler_fill
            ((cubeb_resampler *)in_stack_fffffffffffffda0.data_,
             (void *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (long *)CONCAT44(in_stack_fffffffffffffd94,uVar3),
             (void *)CONCAT44(in_stack_fffffffffffffd8c,uVar2),0x10a718);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)in_stack_fffffffffffffda8.ptr_,(char *)in_stack_fffffffffffffda0.data_,
             (long *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (long *)CONCAT44(in_stack_fffffffffffffd94,uVar3));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.data_);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x10a768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffda0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x1f1,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffda0,(Message *)&stack0xfffffffffffffda8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffda0);
    testing::Message::~Message((Message *)0x10a7a9);
  }
  uVar4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10a7c5);
  if (uVar4 == 0) {
    cubeb_resampler_destroy((cubeb_resampler *)CONCAT44(in_stack_fffffffffffffd94,uVar3));
  }
  return;
}

Assistant:

TEST(cubeb, resampler_output_only_noop)
{
  cubeb_stream_params output_params;
  int target_rate;

  output_params.rate = 44100;
  output_params.channels = 1;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  target_rate = output_params.rate;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, nullptr, &output_params, target_rate,
                           test_output_only_noop_data_cb, nullptr,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);
  const long out_frames = 128;
  float out_buffer[out_frames];
  long got;

  got = cubeb_resampler_fill(resampler, nullptr, nullptr,
                             out_buffer, out_frames);

  ASSERT_EQ(got, out_frames);

  cubeb_resampler_destroy(resampler);
}